

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.c
# Opt level: O2

ALLEGRO_USTR * al_ustr_new_from_utf16(uint16_t *s)

{
  _al_bstring us;
  uint c;
  int iVar1;
  uint uVar2;
  
  us = _al_bfromcstr("");
  uVar2 = 0;
  do {
    c = (uint)s[uVar2];
    if ((ushort)(s[uVar2] + 0x2000) < 0xf800) {
      iVar1 = 1;
      if (c == 0) {
        return us;
      }
    }
    else {
      c = (c & 0x3bf) * 0x400 + (s[(ulong)uVar2 + 1] & 0x3ff) + 0x10000;
      iVar1 = 2;
    }
    al_ustr_append_chr(us,c);
    uVar2 = uVar2 + iVar1;
  } while( true );
}

Assistant:

ALLEGRO_USTR *al_ustr_new_from_utf16(uint16_t const *s)
{
   unsigned int i = 0;
   ALLEGRO_USTR *ustr = al_ustr_new("");
   while (1) {
      int c;
      /* We expect the passed string to be 0 terminated, so there are
       * always 2 words available.
       */
      size_t n = _al_utf16_get(s + i, 2, &c);
      /* Note: The string already is 0 terminated. */
      if (c == 0)
         break;
      al_ustr_append_chr(ustr, c);
      i += n;
   }
   return ustr;
}